

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::DescriptorProto_ExtensionRange::SerializeWithCachedSizesToArray
          (DescriptorProto_ExtensionRange *this,uint8 *target)

{
  bool bVar1;
  int32 iVar2;
  uint32 uVar3;
  UnknownFieldSet *pUVar4;
  byte *local_a8;
  uint8 *target_local;
  DescriptorProto_ExtensionRange *this_local;
  byte *local_28;
  uint8 *local_10;
  
  bVar1 = has_start(this);
  local_a8 = target;
  if (bVar1) {
    iVar2 = start(this);
    uVar3 = internal::WireFormatLite::MakeTag(1,WIRETYPE_VARINT);
    if (uVar3 < 0x80) {
      *target = (byte)uVar3;
      local_10 = target + 1;
    }
    else if (uVar3 < 0x4000) {
      *target = (byte)uVar3 | 0x80;
      target[1] = (uint8)(uVar3 >> 7);
      local_10 = target + 2;
    }
    else {
      local_10 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,target);
    }
    local_a8 = io::CodedOutputStream::WriteVarint32SignExtendedToArray(iVar2,local_10);
  }
  bVar1 = has_end(this);
  if (bVar1) {
    iVar2 = end(this);
    uVar3 = internal::WireFormatLite::MakeTag(2,WIRETYPE_VARINT);
    if (uVar3 < 0x80) {
      *local_a8 = (byte)uVar3;
      local_28 = local_a8 + 1;
    }
    else if (uVar3 < 0x4000) {
      *local_a8 = (byte)uVar3 | 0x80;
      local_a8[1] = (byte)(uVar3 >> 7);
      local_28 = local_a8 + 2;
    }
    else {
      local_28 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,local_a8);
    }
    local_a8 = io::CodedOutputStream::WriteVarint32SignExtendedToArray(iVar2,local_28);
  }
  pUVar4 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar4);
  if (!bVar1) {
    pUVar4 = unknown_fields(this);
    local_a8 = internal::WireFormat::SerializeUnknownFieldsToArray(pUVar4,local_a8);
  }
  return local_a8;
}

Assistant:

::google::protobuf::uint8* DescriptorProto_ExtensionRange::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional int32 start = 1;
  if (has_start()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(1, this->start(), target);
  }

  // optional int32 end = 2;
  if (has_end()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2, this->end(), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}